

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformations.c
# Opt level: O0

void al_transform_coordinates_4d(ALLEGRO_TRANSFORM *trans,float *x,float *y,float *z,float *w)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float rw;
  float rz;
  float ry;
  float rx;
  float *w_local;
  float *z_local;
  float *y_local;
  float *x_local;
  ALLEGRO_TRANSFORM *trans_local;
  
  fVar1 = trans->m[0][1];
  fVar2 = *x;
  fVar3 = trans->m[1][1];
  fVar4 = *y;
  fVar5 = trans->m[2][1];
  fVar6 = *z;
  fVar7 = trans->m[3][1];
  fVar8 = *w;
  fVar9 = trans->m[0][2];
  fVar10 = *x;
  fVar11 = trans->m[1][2];
  fVar12 = *y;
  fVar13 = trans->m[2][2];
  fVar14 = *z;
  fVar15 = trans->m[3][2];
  fVar16 = *w;
  fVar17 = trans->m[0][3];
  fVar18 = *x;
  fVar19 = trans->m[1][3];
  fVar20 = *y;
  fVar21 = trans->m[2][3];
  fVar22 = *z;
  fVar23 = trans->m[3][3];
  fVar24 = *w;
  *x = trans->m[3][0] * *w + trans->m[2][0] * *z + trans->m[0][0] * *x + trans->m[1][0] * *y;
  *y = fVar7 * fVar8 + fVar5 * fVar6 + fVar1 * fVar2 + fVar3 * fVar4;
  *z = fVar15 * fVar16 + fVar13 * fVar14 + fVar9 * fVar10 + fVar11 * fVar12;
  *w = fVar23 * fVar24 + fVar21 * fVar22 + fVar17 * fVar18 + fVar19 * fVar20;
  return;
}

Assistant:

void al_transform_coordinates_4d(const ALLEGRO_TRANSFORM *trans,
   float *x, float *y, float *z, float *w)
{
   float rx, ry, rz, rw;
   ASSERT(trans);
   ASSERT(x);
   ASSERT(y);
   ASSERT(z);
   ASSERT(w);

   #define M(i, j) trans->m[i][j]

   rx = M(0, 0) * *x + M(1, 0) * *y + M(2, 0) * *z + M(3, 0) * *w;
   ry = M(0, 1) * *x + M(1, 1) * *y + M(2, 1) * *z + M(3, 1) * *w;
   rz = M(0, 2) * *x + M(1, 2) * *y + M(2, 2) * *z + M(3, 2) * *w;
   rw = M(0, 3) * *x + M(1, 3) * *y + M(2, 3) * *z + M(3, 3) * *w;

   #undef M

   *x = rx;
   *y = ry;
   *z = rz;
   *w = rw;
}